

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Nodes_ExtractInsert_Test::TestBody(Nodes_ExtractInsert_Test *this)

{
  allocator<int> *this_00;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_00;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_01;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_02;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_03;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  PairMatcher<const_char_*,_const_char_*> *matchers_2;
  key_equal *expected_predicate_value;
  PairMatcher<const_char_*,_const_char_*> matcher_05;
  PairMatcher<const_char_*,_const_char_*> matcher_06;
  char *in_stack_fffffffffffff428;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a18;
  string local_a08;
  AssertHelper local_9e8;
  Message local_9e0;
  bool local_9d1;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_9a0;
  Message local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar__8;
  Message local_978;
  PairMatcher<const_char_*,_const_char_*> local_970;
  PairMatcher<const_char_*,_const_char_*> local_960;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_920;
  Message local_918;
  bool local_909;
  undefined1 local_908 [8];
  AssertionResult gtest_ar__7;
  node_type local_898;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  local_850;
  AssertHelper local_838;
  Message local_830;
  PairMatcher<const_char_*,_const_char_*> local_828;
  testing local_818 [8];
  char *pcStack_810;
  char local_808 [16];
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_7c8;
  Message local_7c0;
  bool local_7b1;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar__6;
  Message local_798;
  iterator local_790;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_750;
  Message local_748;
  bool local_739;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__5;
  string local_6c8;
  AssertHelper local_6a8;
  Message local_6a0;
  bool local_691;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__4;
  Message local_678;
  PairMatcher<const_char_*,_const_char_*> local_670;
  PairMatcher<const_char_*,_const_char_*> local_660;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_650;
  char local_630 [32];
  undefined1 local_610 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_5b8;
  Message local_5b0;
  PairMatcher<const_char_*,_const_char_*> local_5a8;
  PairMatcher<const_char_*,_const_char_*> local_598;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_588;
  char local_568 [32];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_4;
  Message local_530;
  PairMatcher<const_char_*,_const_char_*> local_528;
  testing local_518 [8];
  char *pcStack_510;
  char local_508 [16];
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_4c8;
  Message local_4c0;
  bool local_4b1;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar__3;
  Message local_498;
  PairMatcher<const_char_*,_const_char_*> local_490;
  PairMatcher<const_char_*,_const_char_*> local_480;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_440;
  Message local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__2;
  insert_return_type res;
  StringTable t2;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_328;
  Message local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_;
  Message local_300;
  PairMatcher<const_char_*,_const_char_*> local_2f8;
  PairMatcher<const_char_*,_const_char_*> local_2e8;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_2d8;
  char local_2b8 [32];
  undefined1 local_298 [8];
  AssertionResult gtest_ar_1;
  node_type node;
  Message local_238;
  PairMatcher<const_char_*,_const_char_*> local_230;
  PairMatcher<const_char_*,_const_char_*> local_220;
  PairMatcher<const_char_*,_const_char_*> local_210;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_200;
  char local_1d0 [48];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  StringTable t;
  char k2 [27];
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char k1 [27];
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char k0 [28];
  Nodes_ExtractInsert_Test *this_local;
  
  k1[0x18] = 'V';
  k1[0x19] = 'e';
  k1[0x1a] = 'r';
  cStack_35 = 'y';
  cStack_34 = ' ';
  cStack_33 = 'l';
  cStack_32 = 'o';
  cStack_31 = 'n';
  builtin_strncpy(k1 + 8,"tring one.",0xb);
  k2[0x18] = 'V';
  k2[0x19] = 'e';
  k2[0x1a] = 'r';
  cStack_55 = 'y';
  cStack_54 = ' ';
  cStack_53 = 'l';
  cStack_52 = 'o';
  cStack_51 = 'n';
  builtin_strncpy(k1,"g std::s",8);
  builtin_strncpy(k2 + 8,"tring two.",0xb);
  t.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        )(_Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
          )0x6e6f6c2079726556;
  builtin_strncpy(k2,"g std::s",8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[28],_const_char_(&)[1],_true>
            (&local_178,(char (*) [28])(k1 + 0x18),(char (*) [1])0x21fb59);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>
            (&local_138,(char (*) [27])(k2 + 0x18),(char (*) [1])0x21fb59);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>
            (&local_f8,
             (char (*) [27])
             &t.
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              .settings_,(char (*) [1])0x21fb59);
  local_b8 = &local_178;
  local_b0 = 3;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 1);
  std::allocator<int>::allocator(this_00);
  iVar1._M_len = local_b0;
  iVar1._M_array = local_b8;
  matchers_2 = (PairMatcher<const_char_*,_const_char_*> *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 3);
  expected_predicate_value =
       (key_equal *)
       ((long)&gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       + 2);
  StringTable::raw_hash_set
            ((StringTable *)local_a8,iVar1,0,(hasher *)matchers_2,expected_predicate_value,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 1));
  local_a18 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_b8;
  do {
    local_a18 = local_a18 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_a18);
  } while (local_a18 != &local_178);
  local_210 = testing::Pair<char_const*,char_const*>(k1 + 0x18,"");
  local_220 = testing::Pair<char_const*,char_const*>(k2 + 0x18,"");
  local_230 = testing::Pair<char_const*,char_const*>
                        ((char *)&t.
                                  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                                  .settings_,"");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_200,(testing *)&local_210,&local_220,&local_230,matchers_2);
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_200.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_200.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_200.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_200.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_200.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = in_stack_fffffffffffff428;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_04);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_1a0,local_1d0,(StringTable *)0x21fedb);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  pcVar3 = local_200.matchers_.
           super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
           .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
           ._M_head_impl.first_matcher_;
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               (node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .slot_space_.data + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c4,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               (node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .slot_space_.data + 0x38),&local_238);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               (node.
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                .slot_space_.data + 0x38));
    testing::Message::~Message(&local_238);
    pcVar3 = local_200.matchers_.
             super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
             .
             super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
             ._M_head_impl.first_matcher_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            ((node_type *)&gtest_ar_1.message_,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_a8,(key_arg<char[28]> *)(k1 + 0x18));
  local_2e8 = testing::Pair<char_const*,char_const*>(k2 + 0x18,"");
  local_2f8 = testing::Pair<char_const*,char_const*>
                        ((char *)&t.
                                  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                                  .settings_,"");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_2d8,(testing *)&local_2e8,&local_2f8,
             (PairMatcher<const_char_*,_const_char_*> *)local_2f8.first_matcher_);
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_2d8.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_2d8.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_2d8.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = pcVar3;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_298,local_2b8,(StringTable *)0x21fedb);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  pcVar4 = local_2d8.matchers_.
           super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
           .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
           ._M_head_impl.first_matcher_;
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_300);
    pcVar4 = local_2d8.matchers_.
             super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
             .
             super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
             ._M_head_impl.first_matcher_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  testing::AssertionResult::
  AssertionResult<phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>,std::allocator<int>,void>>
            ((AssertionResult *)local_318,
             (node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
              *)&gtest_ar_1.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar2) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_318,(AssertionResult *)0x21a3bb,
               "false","true",(char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  local_359 = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
              ::empty((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)&gtest_ar_1.message_);
  local_359 = !local_359;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &t2.
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                .settings_,(internal *)local_358,(AssertionResult *)"node.empty()","true","false",
               (char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string
              ((string *)
               &t2.
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                .settings_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  StringTable::StringTable
            ((StringTable *)
             (res.node.
              super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
              .slot_space_.data + 0x38));
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)&gtest_ar__2.message_,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)(res.node.
               super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               .slot_space_.data + 0x38),(node_type *)&gtest_ar_1.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_430,(bool *)&res.position.field_1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar2) {
    testing::Message::Message(&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_430,
               (AssertionResult *)"res.inserted","false","true",(char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_490 = testing::Pair<char_const*,char_const*>(k1 + 0x18,"");
  matcher_05.second_matcher_ = local_490.second_matcher_;
  matcher_05.first_matcher_ = matcher_05.second_matcher_;
  local_480 = (PairMatcher<const_char_*,_const_char_*>)
              testing::internal::
              MakePredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>
                        ((internal *)local_490.first_matcher_,matcher_05);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
  ::iterator::operator*[abi_cxx11_((iterator *)&gtest_ar__2.message_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (local_470,(char *)&local_480,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6ce,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  local_4b1 = node_handle_base::operator_cast_to_bool((node_handle_base *)&res.inserted);
  local_4b1 = !local_4b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b0,&local_4b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_4b0,(AssertionResult *)"res.node",
               "true","false",(char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_528 = testing::Pair<char_const*,char_const*>(k1 + 0x18,"");
  testing::UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>>
            (local_518,&local_528);
  matcher.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = pcVar4;
  matcher.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ = pcStack_510;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_4f8,local_508,(StringTable *)0x2116a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar2) {
    testing::Message::Message(&local_530);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_598 = testing::Pair<char_const*,char_const*>(k2 + 0x18,"");
  local_5a8 = testing::Pair<char_const*,char_const*>
                        ((char *)&t.
                                  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                                  .settings_,"");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_588,(testing *)&local_598,&local_5a8,
             (PairMatcher<const_char_*,_const_char_*> *)local_5a8.first_matcher_);
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_588.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_588.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_588.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = pcVar3;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_548,local_568,(StringTable *)0x21fedb);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar2) {
    testing::Message::Message(&local_5b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[11],_0>
            ((node_type *)&gtest_ar_5.message_,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_a8,(key_arg<char[11]> *)"Not there!");
  node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
  ::operator=((node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
               *)&gtest_ar_1.message_,
              (node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
               *)&gtest_ar_5.message_);
  node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
  ::~node_handle((node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
                  *)&gtest_ar_5.message_);
  local_660 = testing::Pair<char_const*,char_const*>(k2 + 0x18,"");
  local_670 = testing::Pair<char_const*,char_const*>
                        ((char *)&t.
                                  super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                                  .settings_,"");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_650,(testing *)&local_660,&local_670,
             (PairMatcher<const_char_*,_const_char_*> *)local_670.first_matcher_);
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_650.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_650.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_650.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = pcVar3;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_03);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_610,local_630,(StringTable *)0x21fedb);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  pcVar3 = local_650.matchers_.
           super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
           .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
           ._M_head_impl.first_matcher_;
  if (!bVar2) {
    testing::Message::Message(&local_678);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_678);
    pcVar3 = local_650.matchers_.
             super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
             .
             super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
             ._M_head_impl.first_matcher_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  local_691 = node_handle_base::operator_cast_to_bool((node_handle_base *)&gtest_ar_1.message_);
  local_691 = !local_691;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_690,&local_691,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar2) {
    testing::Message::Message(&local_6a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6c8,(internal *)local_690,(AssertionResult *)0x21a3bb,"true","false",
               (char *)expected_predicate_value);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)&local_6c8);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)&gtest_ar__5.message_,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)(res.node.
               super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               .slot_space_.data + 0x38),(node_type *)&gtest_ar_1.message_);
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::operator=((InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
               *)&gtest_ar__2.message_,
              (InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
               *)&gtest_ar__5.message_);
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::~InsertReturnType((InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
                       *)&gtest_ar__5.message_);
  local_739 = (bool)(~res.position.field_1._0_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_738,&local_739,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar2) {
    testing::Message::Message(&local_748);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_738,
               (AssertionResult *)"res.inserted","true","false",(char *)expected_predicate_value);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6da,pcVar4);
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  local_790 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              ::end((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                     *)(res.node.
                        super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                        .slot_space_.data + 0x38));
  testing::internal::EqHelper::
  Compare<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_nullptr>
            ((EqHelper *)local_780,"res.position","t2.end()",(iterator *)&gtest_ar__2.message_,
             &local_790);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar2) {
    testing::Message::Message(&local_798);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6db,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  local_7b1 = node_handle_base::operator_cast_to_bool((node_handle_base *)&res.inserted);
  local_7b1 = !local_7b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b0,&local_7b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar2) {
    testing::Message::Message(&local_7c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_7b0,(AssertionResult *)"res.node",
               "true","false",(char *)expected_predicate_value);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7c8,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper(&local_7c8);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  local_828 = testing::Pair<char_const*,char_const*>(k1 + 0x18,"");
  testing::UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>>
            (local_818,&local_828);
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = pcVar3;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ = pcStack_810;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_7f8,local_808,(StringTable *)0x2116a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar2) {
    testing::Message::Message(&local_830);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_838,&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::emplace<const_char_(&)[28],_const_char_(&)[2],_0>
            (&local_850,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_a8,(char (*) [28])(k1 + 0x18),(char (*) [2])0x211bc8);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            (&local_898,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_a8,(key_arg<char[28]> *)(k1 + 0x18));
  node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
  ::operator=((node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
               *)&gtest_ar_1.message_,&local_898);
  node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
  ::~node_handle(&local_898);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)&gtest_ar__7.message_,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)(res.node.
               super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               .slot_space_.data + 0x38),(node_type *)&gtest_ar_1.message_);
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::operator=((InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
               *)&gtest_ar__2.message_,
              (InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
               *)&gtest_ar__7.message_);
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::~InsertReturnType((InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
                       *)&gtest_ar__7.message_);
  local_909 = (bool)(~res.position.field_1._0_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_908,&local_909,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar2) {
    testing::Message::Message(&local_918);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_908,
               (AssertionResult *)"res.inserted","true","false",(char *)expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  local_970 = testing::Pair<char_const*,char_const*>(k1 + 0x18,"");
  matcher_06.second_matcher_ = local_970.second_matcher_;
  matcher_06.first_matcher_ = matcher_06.second_matcher_;
  local_960 = (PairMatcher<const_char_*,_const_char_*>)
              testing::internal::
              MakePredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>
                        ((internal *)local_970.first_matcher_,matcher_06);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
  ::iterator::operator*[abi_cxx11_((iterator *)&gtest_ar__2.message_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (local_950,(char *)&local_960,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar2) {
    testing::Message::Message(&local_978);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  testing::AssertionResult::
  AssertionResult<phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>,std::allocator<int>,void>>
            ((AssertionResult *)local_990,
             (node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
              *)&res.inserted,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar2) {
    testing::Message::Message(&local_998);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_990,(AssertionResult *)"res.node",
               "false","true",(char *)expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9a0,&local_998);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_9d1 = node_handle_base::operator_cast_to_bool((node_handle_base *)&gtest_ar_1.message_);
  local_9d1 = !local_9d1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9d0,&local_9d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar2) {
    testing::Message::Message(&local_9e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a08,(internal *)local_9d0,(AssertionResult *)0x21a3bb,"true","false",
               (char *)expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9e8,&local_9e0);
    testing::internal::AssertHelper::~AssertHelper(&local_9e8);
    std::__cxx11::string::~string((string *)&local_a08);
    testing::Message::~Message(&local_9e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
  ::~InsertReturnType((InsertReturnType<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>_>
                       *)&gtest_ar__2.message_);
  StringTable::~StringTable
            ((StringTable *)
             (res.node.
              super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
              .slot_space_.data + 0x38));
  node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
  ::~node_handle((node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
                  *)&gtest_ar_1.message_);
  StringTable::~StringTable((StringTable *)local_a8);
  return;
}

Assistant:

TEST(Nodes, ExtractInsert) {
  constexpr char k0[] = "Very long std::string zero.";
  constexpr char k1[] = "Very long std::string one.";
  constexpr char k2[] = "Very long std::string two.";
  StringTable t = {{k0, ""}, {k1, ""}, {k2, ""}};
  EXPECT_THAT(t,
              UnorderedElementsAre(Pair(k0, ""), Pair(k1, ""), Pair(k2, "")));

  auto node = t.extract(k0);
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_TRUE(node);
  EXPECT_FALSE(node.empty());

  StringTable t2;
  StringTable::insert_return_type res = t2.insert(std::move(node));
  EXPECT_TRUE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  // Not there.
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  node = t.extract("Not there!");
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_FALSE(node);

  // Inserting nothing.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_EQ(res.position, t2.end());
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  t.emplace(k0, "1");
  node = t.extract(k0);

  // Insert duplicate.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_TRUE(res.node);
  EXPECT_FALSE(node);
}